

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  GLboolean GVar1;
  wchar_t wVar2;
  _GLFWwindow *window;
  _GLFWwindow *window_00;
  char *format;
  int error;
  _GLFWwndconfig wndconfig;
  int height_1;
  int width_1;
  _GLFWfbconfig fbconfig;
  _GLFWctxconfig ctxconfig;
  _GLFWwndconfig local_b8;
  int local_98;
  int local_94;
  _GLFWfbconfig local_90;
  _GLFWctxconfig local_48;
  
  if (_glfwInitialized == '\0') {
    error = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (0 < width && 0 < height) {
      local_b8.visible = _glfw.hints.visible != 0;
      local_b8.resizable = _glfw.hints.resizable != 0;
      local_b8.decorated = _glfw.hints.decorated != 0;
      local_b8.focused = _glfw.hints.focused != 0;
      local_90.redBits = _glfw.hints.redBits;
      local_90.blueBits = _glfw.hints.blueBits;
      local_90.greenBits = _glfw.hints.greenBits;
      local_b8.autoIconify = _glfw.hints.autoIconify != 0;
      local_90._12_8_ = _glfw.hints._12_8_;
      local_90._20_8_ = _glfw.hints._20_8_;
      local_90._28_8_ = _glfw.hints._28_8_;
      local_b8.floating = _glfw.hints.floating != 0;
      local_90._36_8_ = _glfw.hints._36_8_;
      local_90.stereo = (int)(_glfw.hints.stereo != 0);
      local_48.api = _glfw.hints.api;
      local_48.forward = _glfw.hints.forward != 0;
      local_48._4_8_ = _glfw.hints._92_8_;
      local_90._48_8_ = _glfw.hints._72_8_;
      local_48.debug = _glfw.hints.debug != 0;
      local_90.doublebuffer = (int)(_glfw.hints.doublebuffer != 0);
      local_48.profile = _glfw.hints.profile;
      local_48.robustness = _glfw.hints.robustness;
      local_48.release = _glfw.hints.release;
      local_b8.width = width;
      local_b8.height = height;
      local_b8.title = title;
      local_b8.monitor = (_GLFWmonitor *)monitor;
      local_48.share = (_GLFWwindow *)share;
      GVar1 = _glfwIsValidContextConfig(&local_48);
      if (GVar1 != '\0') {
        window = (_GLFWwindow *)calloc(1,0x2c0);
        window->next = _glfw.windowListHead;
        _glfw.windowListHead = window;
        if (local_b8.monitor != (_GLFWmonitor *)0x0) {
          local_b8.resizable = '\x01';
          local_b8.visible = '\x01';
          local_b8.focused = '\x01';
          (window->videoMode).width = width;
          (window->videoMode).height = height;
          (window->videoMode).redBits = _glfw.hints.redBits;
          (window->videoMode).greenBits = _glfw.hints.greenBits;
          (window->videoMode).blueBits = _glfw.hints.blueBits;
          (window->videoMode).refreshRate = _glfw.hints.refreshRate;
        }
        window->monitor = local_b8.monitor;
        window->resizable = local_b8.resizable;
        window->decorated = local_b8.decorated;
        window->autoIconify = local_b8.autoIconify;
        window->floating = local_b8.floating;
        window->cursorMode = 0x34001;
        window_00 = _glfwPlatformGetCurrentContext();
        wVar2 = _glfwPlatformCreateWindow(window,&local_b8,&local_48,&local_90);
        if (wVar2 != L'\0') {
          _glfwPlatformMakeContextCurrent(window);
          GVar1 = _glfwRefreshContextAttribs(&local_48);
          if ((GVar1 != '\0') && (GVar1 = _glfwIsValidContext(&local_48), GVar1 != '\0')) {
            glClear(0x4000);
            _glfwPlatformSwapBuffers(window);
            _glfwPlatformMakeContextCurrent(window_00);
            if (local_b8.monitor != (_GLFWmonitor *)0x0) {
              _glfwPlatformGetWindowSize(window,&local_94,&local_98);
              window->cursorPosX = (double)(local_94 / 2);
              window->cursorPosY = (double)(local_98 / 2);
              _glfwPlatformSetCursorPos(window,(double)(local_94 / 2),(double)(local_98 / 2));
              return (GLFWwindow *)window;
            }
            if (local_b8.visible == '\0') {
              return (GLFWwindow *)window;
            }
            if (local_b8.focused != '\0') {
              _glfwPlatformShowWindow(window);
              return (GLFWwindow *)window;
            }
            _glfwPlatformUnhideWindow(window);
            return (GLFWwindow *)window;
          }
        }
        glfwDestroyWindow((GLFWwindow *)window);
        _glfwPlatformMakeContextCurrent(window_00);
      }
      return (GLFWwindow *)0x0;
    }
    format = "Invalid window size";
    error = 0x10004;
  }
  _glfwInputError(error,format);
  return (GLFWwindow *)0x0;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;
    _GLFWwindow* previous;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid window size");
        return NULL;
    }

    // Set up desired framebuffer config
    fbconfig.redBits        = _glfw.hints.redBits;
    fbconfig.greenBits      = _glfw.hints.greenBits;
    fbconfig.blueBits       = _glfw.hints.blueBits;
    fbconfig.alphaBits      = _glfw.hints.alphaBits;
    fbconfig.depthBits      = _glfw.hints.depthBits;
    fbconfig.stencilBits    = _glfw.hints.stencilBits;
    fbconfig.accumRedBits   = _glfw.hints.accumRedBits;
    fbconfig.accumGreenBits = _glfw.hints.accumGreenBits;
    fbconfig.accumBlueBits  = _glfw.hints.accumBlueBits;
    fbconfig.accumAlphaBits = _glfw.hints.accumAlphaBits;
    fbconfig.auxBuffers     = _glfw.hints.auxBuffers;
    fbconfig.stereo         = _glfw.hints.stereo ? GL_TRUE : GL_FALSE;
    fbconfig.samples        = _glfw.hints.samples;
    fbconfig.sRGB           = _glfw.hints.sRGB;
    fbconfig.doublebuffer   = _glfw.hints.doublebuffer ? GL_TRUE : GL_FALSE;

    // Set up desired window config
    wndconfig.width         = width;
    wndconfig.height        = height;
    wndconfig.title         = title;
    wndconfig.resizable     = _glfw.hints.resizable ? GL_TRUE : GL_FALSE;
    wndconfig.visible       = _glfw.hints.visible ? GL_TRUE : GL_FALSE;
    wndconfig.decorated     = _glfw.hints.decorated ? GL_TRUE : GL_FALSE;
    wndconfig.focused       = _glfw.hints.focused ? GL_TRUE : GL_FALSE;
    wndconfig.autoIconify   = _glfw.hints.autoIconify ? GL_TRUE : GL_FALSE;
    wndconfig.floating      = _glfw.hints.floating ? GL_TRUE : GL_FALSE;
    wndconfig.monitor       = (_GLFWmonitor*) monitor;

    // Set up desired context config
    ctxconfig.api           = _glfw.hints.api;
    ctxconfig.major         = _glfw.hints.major;
    ctxconfig.minor         = _glfw.hints.minor;
    ctxconfig.forward       = _glfw.hints.forward ? GL_TRUE : GL_FALSE;
    ctxconfig.debug         = _glfw.hints.debug ? GL_TRUE : GL_FALSE;
    ctxconfig.profile       = _glfw.hints.profile;
    ctxconfig.robustness    = _glfw.hints.robustness;
    ctxconfig.release       = _glfw.hints.release;
    ctxconfig.share         = (_GLFWwindow*) share;

    // Check the OpenGL bits of the window config
    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    if (wndconfig.monitor)
    {
        wndconfig.resizable = GL_TRUE;
        wndconfig.visible   = GL_TRUE;
        wndconfig.focused   = GL_TRUE;

        // Set up desired video mode
        window->videoMode.width       = width;
        window->videoMode.height      = height;
        window->videoMode.redBits     = _glfw.hints.redBits;
        window->videoMode.greenBits   = _glfw.hints.greenBits;
        window->videoMode.blueBits    = _glfw.hints.blueBits;
        window->videoMode.refreshRate = _glfw.hints.refreshRate;
    }

    // Transfer window hints that are persistent settings and not
    // just initial states
    window->monitor     = wndconfig.monitor;
    window->resizable   = wndconfig.resizable;
    window->decorated   = wndconfig.decorated;
    window->autoIconify = wndconfig.autoIconify;
    window->floating    = wndconfig.floating;
    window->cursorMode  = GLFW_CURSOR_NORMAL;

    // Save the currently current context so it can be restored later
    previous = _glfwPlatformGetCurrentContext();

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        _glfwPlatformMakeContextCurrent(previous);
        return NULL;
    }

    _glfwPlatformMakeContextCurrent(window);

    // Retrieve the actual (as opposed to requested) context attributes
    if (!_glfwRefreshContextAttribs(&ctxconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        _glfwPlatformMakeContextCurrent(previous);
        return NULL;
    }

    // Verify the context against the requested parameters
    if (!_glfwIsValidContext(&ctxconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        _glfwPlatformMakeContextCurrent(previous);
        return NULL;
    }

    // Clearing the front buffer to black to avoid garbage pixels left over
    // from previous uses of our bit of VRAM
    glClear(GL_COLOR_BUFFER_BIT);
    _glfwPlatformSwapBuffers(window);

    // Restore the previously current context (or NULL)
    _glfwPlatformMakeContextCurrent(previous);

    if (wndconfig.monitor)
    {
        int width, height;
        _glfwPlatformGetWindowSize(window, &width, &height);

        window->cursorPosX = width / 2;
        window->cursorPosY = height / 2;

        _glfwPlatformSetCursorPos(window, window->cursorPosX, window->cursorPosY);
    }
    else
    {
        if (wndconfig.visible)
        {
            if (wndconfig.focused)
                _glfwPlatformShowWindow(window);
            else
                _glfwPlatformUnhideWindow(window);
        }
    }

    return (GLFWwindow*) window;
}